

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

expression_ptr __thiscall mjs::parser::parse_member_expression(parser *this)

{
  undefined8 uVar1;
  token_type tVar2;
  undefined8 uVar3;
  element_type *peVar4;
  int iVar5;
  wstring *in_RCX;
  pointer *__ptr;
  parser *in_RSI;
  _Alloc_hider _Var6;
  _Alloc_hider _Var7;
  wstring_view id_00;
  undefined1 local_c8 [16];
  token id_token;
  wstring id;
  source_extend id_extend;
  undefined1 local_44 [44];
  
  local_c8._0_8_ = (pointer)0x0;
  iVar5 = (int)in_RSI;
  accept((parser *)&id_token,iVar5,(sockaddr *)0x59,(socklen_t *)in_RCX);
  tVar2 = id_token.type_;
  token::destroy(&id_token);
  if (tVar2 != eof) {
    parse_member_expression((parser *)&id);
    if ((in_RSI->current_token_).type_ == lparen) {
      parse_argument_list((expression_list *)&id_token,in_RSI);
      make_expression<mjs::call_expression,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>>
                ((parser *)&id_extend,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)in_RSI,
                 (vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                  *)&id);
      peVar4 = id_extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      _Var7 = id._M_dataplus;
      id_extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      id._M_dataplus._M_p = (pointer)peVar4;
      if ((_Var7._M_p != (pointer)0x0) &&
         ((**(code **)(*(long *)_Var7._M_p + 8))(),
         id_extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0)) {
        (**(code **)(*(long *)id_extend.file.
                              super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 8))();
      }
      id_extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::
      vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
      ::~vector((vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                 *)&id_token);
    }
    id_extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(id_extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr._4_4_,0x59);
    in_RCX = &id;
    make_expression<mjs::prefix_expression,mjs::token_type,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              ((parser *)&id_token,(token_type *)in_RSI,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)&id_extend);
    uVar3 = id_token._0_8_;
    uVar1 = local_c8._0_8_;
    id_token.type_ = whitespace;
    id_token._4_4_ = 0;
    local_c8._0_8_ = uVar3;
    _Var7 = id._M_dataplus;
    if ((pointer)uVar1 == (pointer)0x0) goto LAB_001680e4;
    (**(code **)(*(long *)uVar1 + 8))();
    _Var7 = id._M_dataplus;
    if (id_token._0_8_ == 0) goto LAB_001680e4;
    (**(code **)(*(long *)id_token._0_8_ + 8))();
    _Var7 = id._M_dataplus;
    goto LAB_001680e4;
  }
  if (0 < (int)in_RSI->version_) {
    accept((parser *)&id_token,iVar5,(sockaddr *)0x4d,(socklen_t *)in_RCX);
    tVar2 = id_token.type_;
    token::destroy(&id_token);
    if (tVar2 != eof) {
      id._M_dataplus._M_p = (pointer)&id.field_2;
      id._M_string_length = 0;
      id.field_2._M_local_buf[0] = L'\0';
      current_extend(&id_extend,in_RSI);
      accept((parser *)&id_token,iVar5,(sockaddr *)0x2,(socklen_t *)in_RCX);
      if (id_token.type_ != eof) {
        token::text_abi_cxx11_(&id_token);
        std::__cxx11::wstring::_M_assign((wstring *)&id);
      }
      token::destroy(&id_token);
      parse_function_abi_cxx11_
                ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                  *)&id_token,in_RSI);
      iVar5 = (**(code **)(*(long *)id_token._0_8_ + 0x18))();
      if (iVar5 != 0) {
        __assert_fail("block->type() == statement_type::block",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                      ,0x2c3,"expression_ptr mjs::parser::parse_member_expression()");
      }
      if (*(char *)(id_token._0_8_ + 0x38) == '\x01') {
        id_00._M_str = id._M_dataplus._M_p;
        id_00._M_len = id._M_string_length;
        check_function_name(in_RSI,id_00,&id_extend);
      }
      make_expression<mjs::function_expression,mjs::source_extend&,std::__cxx11::wstring&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                (this,(source_extend *)in_RSI,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 ((long)&id_token.field_1 + 0x18),
                 (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                  *)&id,(unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                        &id_token.field_1.text_);
      std::
      _Tuple_impl<0UL,_mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
      ::~_Tuple_impl((_Tuple_impl<0UL,_mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                      *)&id_token);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&id_extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::wstring::~wstring((wstring *)&id);
      if ((pointer)local_c8._0_8_ == (pointer)0x0) {
        return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
               (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
               this;
      }
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
      return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
             (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
             this;
    }
  }
  parse_primary_expression((parser *)&id_token);
  uVar1 = id_token._0_8_;
  _Var6._M_p = (pointer)local_c8._0_8_;
  id_token.type_ = whitespace;
  id_token._4_4_ = 0;
  local_c8._0_8_ = uVar1;
  if (_Var6._M_p != (pointer)0x0) goto LAB_001680d9;
  while( true ) {
    while( true ) {
      accept((parser *)&id_token,iVar5,(sockaddr *)0x32,(socklen_t *)in_RCX);
      tVar2 = id_token.type_;
      token::destroy(&id_token);
      if (tVar2 == eof) break;
      parse_expression((parser *)&id_token);
      expect((token *)(local_44 + 4),in_RSI,rbracket,"parse_member_expression",0x2ce);
      token::destroy((token *)(local_44 + 4));
      id_extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(id_extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._4_4_,0x32);
      in_RCX = (wstring *)local_c8;
      make_expression<mjs::binary_expression,mjs::token_type,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                ((parser *)&id,(token_type *)in_RSI,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)&id_extend,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_c8);
      _Var7 = id._M_dataplus;
      uVar1 = local_c8._0_8_;
      local_c8._0_8_ = id._M_dataplus._M_p;
      id._M_dataplus._M_p = (pointer)0x0;
      _Var7._M_p = (pointer)id_token._0_8_;
      if (((element_type *)uVar1 != (element_type *)0x0) &&
         ((**(code **)(*(long *)uVar1 + 8))(), _Var6 = id._M_dataplus,
         _Var7._M_p = (pointer)id_token._0_8_, id._M_dataplus._M_p != (pointer)0x0)) {
LAB_001680d9:
        (**(code **)(*(long *)_Var6._M_p + 8))();
        _Var7._M_p = (pointer)id_token._0_8_;
      }
LAB_001680e4:
      if (_Var7._M_p != (pointer)0x0) {
        (**(code **)(*(long *)_Var7._M_p + 8))();
      }
    }
    accept((parser *)&id_token,iVar5,(sockaddr *)0x25,(socklen_t *)in_RCX);
    tVar2 = id_token.type_;
    token::destroy(&id_token);
    if (tVar2 == eof) break;
    local_44._0_4_ = 0x25;
    get_identifier_name_abi_cxx11_(&id,in_RSI,"parse_member_expression",0x2d1);
    token::token(&id_token,string_literal,&id);
    make_expression<mjs::literal_expression,mjs::token>((parser *)(local_c8 + 8),(token *)in_RSI);
    in_RCX = (wstring *)local_c8;
    make_expression<mjs::binary_expression,mjs::token_type,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              ((parser *)&id_extend,(token_type *)in_RSI,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_44,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_c8);
    peVar4 = id_extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar1 = local_c8._0_8_;
    id_extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_c8._0_8_ = peVar4;
    if (((element_type *)uVar1 != (element_type *)0x0) &&
       ((**(code **)(*(long *)uVar1 + 8))(),
       id_extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0)) {
      (**(code **)(*(long *)id_extend.file.
                            super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  + 8))();
    }
    id_extend.file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    if ((long *)local_c8._8_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_c8._8_8_ + 8))();
    }
    local_c8._8_8_ = (long *)0x0;
    token::destroy(&id_token);
    std::__cxx11::wstring::~wstring((wstring *)&id);
  }
  (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c8._0_8_;
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parse_member_expression() {
        // MemberExpression :
        //  PrimaryExpression
        //  FunctionExpression
        //  MemberExpression [ Expression ]
        //  MemberExpression . Identifier (IdentifierName in ES5+)
        //  new MemberExpression Arguments

        expression_ptr me{};
        if (accept(token_type::new_)) {
            auto e = parse_member_expression();
            if (current_token_type() == token_type::lparen) {
                e = make_expression<call_expression>(std::move(e), parse_argument_list());
            }
            me = make_expression<prefix_expression>(token_type::new_, std::move(e));
        } else if (version_ >= version::es3 && accept(token_type::function_)) {
            std::wstring id{};
            const auto id_extend = current_extend();
            if (auto id_token = accept(token_type::identifier)) {
                id = id_token.text();
            }
            auto [extend, params, block] = parse_function();
            assert(block->type() == statement_type::block);
            if (static_cast<const block_statement&>(*block).strict_mode()) {
                check_function_name(id, id_extend);
            }
            return make_expression<function_expression>(extend, id, std::move(params), std::move(block));
        } else {
            me = parse_primary_expression();
        }
        for (;;) {
            if (accept(token_type::lbracket)) {
                auto e = parse_expression();
                EXPECT(token_type::rbracket);
                me = make_expression<binary_expression>(token_type::lbracket, std::move(me), std::move(e));
            } else if (accept(token_type::dot)) {
                me = make_expression<binary_expression>(token_type::dot, std::move(me), make_expression<literal_expression>(token{token_type::string_literal, get_identifier_name(__func__, __LINE__)}));
            } else {
                return me;
            }
        }
    }